

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O3

void rtext_key(_rtext *x,int keynum,t_symbol *keysym)

{
  size_t newsize;
  int *i;
  undefined1 *puVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  int iVar10;
  size_t oldsize;
  uint32_t ch;
  int h;
  int w;
  int indx;
  int local_3c [3];
  
  local_3c[1] = 0;
  local_3c[0] = 0;
  if (keynum == 0) {
    pcVar6 = keysym->s_name;
    iVar4 = strcmp(pcVar6,"Home");
    if (iVar4 == 0) {
      iVar4 = x->x_selstart;
      x->x_selstart = 0;
      if (x->x_selend == iVar4) {
        x->x_selend = 0;
      }
      goto LAB_00153a91;
    }
    iVar4 = strcmp(pcVar6,"End");
    if (iVar4 == 0) {
      uVar5 = x->x_bufsize;
      if (x->x_selend == x->x_selstart) {
        x->x_selstart = uVar5;
      }
    }
    else {
      iVar4 = strcmp(pcVar6,"Right");
      if (iVar4 == 0) {
        iVar4 = x->x_selend;
        if ((iVar4 != x->x_selstart) || (x->x_bufsize <= iVar4)) {
          x->x_selstart = iVar4;
          goto LAB_00153a91;
        }
        u8_inc(x->x_buf,&x->x_selstart);
LAB_00153a8b:
        uVar5 = x->x_selstart;
      }
      else {
        iVar4 = strcmp(pcVar6,"Left");
        if (iVar4 == 0) {
          uVar5 = x->x_selstart;
          if (0 < (int)uVar5 && x->x_selend == uVar5) {
            u8_dec(x->x_buf,&x->x_selstart);
            goto LAB_00153a8b;
          }
        }
        else {
          if (((*pcVar6 != 'U') || (pcVar6[1] != 'p')) || (pcVar6[2] != '\0')) {
            iVar4 = strcmp(pcVar6,"Down");
            if (iVar4 == 0) {
              iVar4 = x->x_selend;
              if (iVar4 < x->x_bufsize) {
                do {
                  cVar2 = x->x_buf[iVar4];
                  u8_inc(x->x_buf,&x->x_selend);
                  iVar4 = x->x_selend;
                  if (cVar2 == '\n') break;
                } while (iVar4 < x->x_bufsize);
              }
              x->x_selstart = iVar4;
            }
            goto LAB_00153a91;
          }
          if (x->x_selstart == 0) {
            uVar5 = 0;
          }
          else {
            i = &x->x_selstart;
            u8_dec(x->x_buf,i);
            uVar5 = x->x_selstart;
            while ((0 < (int)uVar5 && (x->x_buf[uVar5] != '\n'))) {
              u8_dec(x->x_buf,i);
              uVar5 = *i;
            }
          }
        }
      }
    }
    x->x_selend = uVar5;
    goto LAB_00153a91;
  }
  if (keynum == 10) {
    ch = 10;
    if ((~x->x_text->field_0x2e & 3) == 0) {
      gatom_key(x->x_text,keysym,10.0);
      return;
    }
  }
  else {
    ch = 10;
    if (keynum != 0xd) {
      ch = keynum;
    }
    if (keynum == 0x7f) {
      if ((x->x_selend < x->x_bufsize) && (x->x_selstart == x->x_selend)) {
        u8_inc(x->x_buf,&x->x_selend);
      }
    }
    else if (((keynum == 8) && (x->x_selstart != 0)) && (x->x_selstart == x->x_selend)) {
      u8_dec(x->x_buf,&x->x_selstart);
    }
  }
  iVar4 = x->x_selend;
  lVar7 = (long)iVar4;
  iVar3 = x->x_selstart;
  lVar8 = (long)iVar3;
  iVar10 = x->x_bufsize;
  if (iVar4 < iVar10) {
    do {
      x->x_buf[lVar8] = x->x_buf[lVar7];
      lVar7 = lVar7 + 1;
      iVar10 = x->x_bufsize;
      sVar9 = (size_t)iVar10;
      lVar8 = lVar8 + 1;
    } while (lVar7 < (long)sVar9);
  }
  else {
    sVar9 = (size_t)iVar10;
  }
  iVar10 = iVar10 - (iVar4 - iVar3);
  oldsize = (size_t)iVar10;
  newsize = oldsize + 1;
  pcVar6 = (char *)resizebytes(x->x_buf,sVar9,newsize);
  x->x_buf = pcVar6;
  pcVar6[oldsize] = '\0';
  x->x_bufsize = iVar10;
  if (ch == 10 || ch - 0x20 < 0x5f) {
    pcVar6 = (char *)resizebytes(x->x_buf,oldsize,(long)(iVar10 + 2));
    x->x_buf = pcVar6;
    lVar7 = (long)x->x_bufsize;
    lVar8 = (long)x->x_selstart;
    if (x->x_selstart < x->x_bufsize) {
      do {
        x->x_buf[lVar7] = x->x_buf[lVar7 + -1];
        lVar7 = lVar7 + -1;
        lVar8 = (long)x->x_selstart;
      } while (lVar8 < lVar7);
      pcVar6 = x->x_buf;
    }
    pcVar6[lVar8] = (char)ch;
    x->x_buf[newsize] = '\0';
    x->x_bufsize = (int)newsize;
    iVar4 = x->x_selstart + 1;
LAB_00153a1f:
    x->x_selstart = iVar4;
  }
  else {
    if (0x7f < (int)ch) {
      iVar4 = u8_wc_nbytes(ch);
      sVar9 = (size_t)x->x_bufsize;
      lVar7 = sVar9 + (long)iVar4;
      pcVar6 = (char *)resizebytes(x->x_buf,sVar9,sVar9 + (long)iVar4 + 1);
      x->x_buf = pcVar6;
      iVar3 = (int)lVar7;
      iVar10 = iVar3 + -1;
      if (x->x_selstart < iVar10) {
        lVar8 = (long)iVar10;
        do {
          x->x_buf[lVar8] = x->x_buf[lVar8 - iVar4];
          lVar8 = lVar8 + -1;
        } while (x->x_selstart < lVar8);
        pcVar6 = x->x_buf;
      }
      pcVar6[lVar7] = '\0';
      x->x_bufsize = iVar3;
      strncpy(x->x_buf + x->x_selstart,keysym->s_name,(long)iVar4);
      iVar4 = x->x_selstart + iVar4;
      goto LAB_00153a1f;
    }
    iVar4 = x->x_selstart;
  }
  x->x_selend = iVar4;
  puVar1 = &x->x_glist->gl_editor->field_0x88;
  *puVar1 = *puVar1 | 0x10;
LAB_00153a91:
  rtext_senditup(x,2,local_3c + 1,local_3c,local_3c + 2);
  return;
}

Assistant:

void rtext_key(t_rtext *x, int keynum, t_symbol *keysym)
{
    int w = 0, h = 0, indx, i, newsize, ndel;
    char *s1, *s2;
        /* CR to atom boxes sends message and resets */
    if (keynum == '\n' && x->x_text->te_type == T_ATOM)
    {
        gatom_key(x->x_text, keysym, keynum);
        return;
    }
    if (keynum)
    {
        int n = keynum;
        if (n == '\r') n = '\n';
        if (n == '\b')  /* backspace */
        {
                    /* LATER delete the box if all text is selected...
                    this causes reentrancy problems now. */
            /* if ((!x->x_selstart) && (x->x_selend == x->x_bufsize))
            {
                ....
            } */
            if (x->x_selstart && (x->x_selstart == x->x_selend))
                u8_dec(x->x_buf, &x->x_selstart);
        }
        else if (n == 127)      /* delete */
        {
            if (x->x_selend < x->x_bufsize && (x->x_selstart == x->x_selend))
                u8_inc(x->x_buf, &x->x_selend);
        }

        ndel = x->x_selend - x->x_selstart;
        for (i = x->x_selend; i < x->x_bufsize; i++)
            x->x_buf[i- ndel] = x->x_buf[i];
        newsize = x->x_bufsize - ndel;
            /* allocate extra space for hidden null terminator */
        x->x_buf = resizebytes(x->x_buf, x->x_bufsize, newsize+1);
        x->x_buf[newsize] = 0;
        x->x_bufsize = newsize;

/* at Guenter's suggestion, use 'n>31' to test whether a character might
be printable in whatever 8-bit character set we find ourselves. */

/*-- moo:
  ... but test with "<" rather than "!=" in order to accommodate unicode
  codepoints for n (which we get since Tk is sending the "%A" substitution
  for bind <Key>), effectively reducing the coverage of this clause to 7
  bits.  Case n>127 is covered by the next clause.
*/
        if (n == '\n' || (n > 31 && n < 127))
        {
            newsize = x->x_bufsize+1;
                /* allocate extra space for hidden null terminator */
            x->x_buf = resizebytes(x->x_buf, x->x_bufsize, newsize+1);
            for (i = x->x_bufsize; i > x->x_selstart; i--)
                x->x_buf[i] = x->x_buf[i-1];
            x->x_buf[x->x_selstart] = n;
            x->x_buf[newsize] = 0;
            x->x_bufsize = newsize;
            x->x_selstart = x->x_selstart + 1;
        }
        /*--moo: check for unicode codepoints beyond 7-bit ASCII --*/
        else if (n > 127)
        {
            int ch_nbytes = u8_wc_nbytes(n);
            newsize = x->x_bufsize + ch_nbytes;
                /* allocate extra space for hidden null terminator */
            x->x_buf = resizebytes(x->x_buf, x->x_bufsize, newsize+1);

            for (i = newsize-1; i > x->x_selstart; i--)
                x->x_buf[i] = x->x_buf[i-ch_nbytes];
            x->x_buf[newsize] = 0;
            x->x_bufsize = newsize;
            /*-- moo: assume canvas_key() has encoded keysym as UTF-8 */
            strncpy(x->x_buf+x->x_selstart, keysym->s_name, ch_nbytes);
            x->x_selstart = x->x_selstart + ch_nbytes;
        }
        x->x_selend = x->x_selstart;
        x->x_glist->gl_editor->e_textdirty = 1;
    }
    else if (!strcmp(keysym->s_name, "Home"))
    {
        if (x->x_selend == x->x_selstart)
        {
            x->x_selend = x->x_selstart = 0;
        }
        else
            x->x_selstart = 0;
    }
    else if (!strcmp(keysym->s_name, "End"))
    {
        if (x->x_selend == x->x_selstart)
        {
            x->x_selend = x->x_selstart = x->x_bufsize;
        }
        else
            x->x_selend = x->x_bufsize;
    }
    else if (!strcmp(keysym->s_name, "Right"))
    {
        if (x->x_selend == x->x_selstart && x->x_selstart < x->x_bufsize)
        {
            u8_inc(x->x_buf, &x->x_selstart);
            x->x_selend = x->x_selstart;
        }
        else
            x->x_selstart = x->x_selend;
    }
    else if (!strcmp(keysym->s_name, "Left"))
    {
        if (x->x_selend == x->x_selstart && x->x_selstart > 0)
        {
            u8_dec(x->x_buf, &x->x_selstart);
            x->x_selend = x->x_selstart;
        }
        else
            x->x_selend = x->x_selstart;
    }
        /* this should be improved...  life's too short */
    else if (!strcmp(keysym->s_name, "Up"))
    {
        if (x->x_selstart)
            u8_dec(x->x_buf, &x->x_selstart);
        while (x->x_selstart > 0 && x->x_buf[x->x_selstart] != '\n')
            u8_dec(x->x_buf, &x->x_selstart);
        x->x_selend = x->x_selstart;
    }
    else if (!strcmp(keysym->s_name, "Down"))
    {
        while (x->x_selend < x->x_bufsize &&
            x->x_buf[x->x_selend] != '\n')
            u8_inc(x->x_buf, &x->x_selend);
        if (x->x_selend < x->x_bufsize)
            u8_inc(x->x_buf, &x->x_selend);
        x->x_selstart = x->x_selend;
    }
    rtext_senditup(x, SEND_UPDATE, &w, &h, &indx);
}